

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformsurface.cpp
# Opt level: O1

QDebug operator<<(QDebug debug,QPlatformSurface *surface)

{
  QTextStream *pQVar1;
  QSurface *this;
  _func_int **pp_Var2;
  SurfaceClass SVar3;
  uint uVar4;
  void *in_RDX;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QDebugStateSaver saver;
  undefined1 local_88 [32];
  QDebug local_68;
  QDebug local_60;
  undefined1 *local_58;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_58,(QDebug *)surface);
  pQVar1 = (QTextStream *)surface->_vptr_QPlatformSurface;
  pQVar1[0x30] = (QTextStream)0x0;
  QVar5.m_data = (storage_type *)0x11;
  QVar5.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar5);
  QTextStream::operator<<(pQVar1,&local_50);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (((QTextStream *)surface->_vptr_QPlatformSurface)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)surface->_vptr_QPlatformSurface,' ');
  }
  QTextStream::operator<<((QTextStream *)surface->_vptr_QPlatformSurface,in_RDX);
  if (((QTextStream *)surface->_vptr_QPlatformSurface)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)surface->_vptr_QPlatformSurface,' ');
  }
  if (in_RDX != (void *)0x0) {
    this = *(QSurface **)((long)in_RDX + 8);
    SVar3 = QSurface::surfaceClass(this);
    pQVar1 = (QTextStream *)surface->_vptr_QPlatformSurface;
    QVar6.m_data = (storage_type *)0x8;
    QVar6.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar6);
    QTextStream::operator<<(pQVar1,&local_50);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (((QTextStream *)surface->_vptr_QPlatformSurface)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)surface->_vptr_QPlatformSurface,' ');
    }
    local_68.stream = (Stream *)surface->_vptr_QPlatformSurface;
    (local_68.stream)->ref = (local_68.stream)->ref + 1;
    qt_QMetaEnum_debugOperator
              ((QDebug *)&local_60,(longlong)&local_68,(QMetaObject *)(ulong)SVar3,
               (char *)&QSurface::staticMetaObject);
    QDebug::~QDebug(&local_60);
    QDebug::~QDebug(&local_68);
    pQVar1 = (QTextStream *)surface->_vptr_QPlatformSurface;
    QVar7.m_data = (storage_type *)0x7;
    QVar7.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar7);
    QTextStream::operator<<(pQVar1,&local_50);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (((QTextStream *)surface->_vptr_QPlatformSurface)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)surface->_vptr_QPlatformSurface,' ');
    }
    local_88._16_8_ = surface->_vptr_QPlatformSurface;
    *(int *)(local_88._16_8_ + 0x28) = *(int *)(local_88._16_8_ + 0x28) + 1;
    uVar4 = (*this->_vptr_QSurface[4])(this);
    qt_QMetaEnum_debugOperator
              ((QDebug *)(local_88 + 0x18),(longlong)(local_88 + 0x10),(QMetaObject *)(ulong)uVar4,
               (char *)&QSurface::staticMetaObject);
    QDebug::~QDebug((QDebug *)(local_88 + 0x18));
    QDebug::~QDebug((QDebug *)(local_88 + 0x10));
    pQVar1 = (QTextStream *)surface->_vptr_QPlatformSurface;
    if (SVar3 == Window) {
      QVar9.m_data = (storage_type *)0x9;
      QVar9.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar9);
      QTextStream::operator<<(pQVar1,&local_50);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (((QTextStream *)surface->_vptr_QPlatformSurface)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)surface->_vptr_QPlatformSurface,' ');
      }
      local_88._0_8_ = surface->_vptr_QPlatformSurface;
      ((Stream *)local_88._0_8_)->ref = ((Stream *)local_88._0_8_)->ref + 1;
      operator<<((Stream *)(local_88 + 8),(QWindow *)local_88);
      QDebug::~QDebug((QDebug *)(local_88 + 8));
      QDebug::~QDebug((QDebug *)local_88);
    }
    else {
      QVar8.m_data = (storage_type *)0xa;
      QVar8.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar8);
      QTextStream::operator<<(pQVar1,&local_50);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (((QTextStream *)surface->_vptr_QPlatformSurface)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)surface->_vptr_QPlatformSurface,' ');
      }
      QTextStream::operator<<((QTextStream *)surface->_vptr_QPlatformSurface,this);
      if (((QTextStream *)surface->_vptr_QPlatformSurface)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)surface->_vptr_QPlatformSurface,' ');
      }
    }
  }
  QTextStream::operator<<((QTextStream *)surface->_vptr_QPlatformSurface,')');
  if (((QTextStream *)surface->_vptr_QPlatformSurface)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)surface->_vptr_QPlatformSurface,' ');
  }
  pp_Var2 = surface->_vptr_QPlatformSurface;
  surface->_vptr_QPlatformSurface = (_func_int **)0x0;
  *(_func_int ***)debug.stream = pp_Var2;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

Q_GUI_EXPORT QDebug operator<<(QDebug debug, const QPlatformSurface *surface)
{
    QDebugStateSaver saver(debug);
    debug.nospace();
    debug << "QPlatformSurface(" << (const void *)surface;
    if (surface) {
        QSurface *s = surface->surface();
        auto surfaceClass = s->surfaceClass();
        debug << ", class=" << surfaceClass;
        debug << ", type=" << s->surfaceType();
        if (surfaceClass == QSurface::Window)
            debug << ", window=" << static_cast<QWindow *>(s);
        else
            debug << ", surface=" << s;
    }
    debug << ')';
    return debug;
}